

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equipartitionTest.cpp
# Opt level: O0

void __thiscall OpenMD::Equipartition::doFrame(Equipartition *this,int param_2)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  long in_RDI;
  RealType RVar5;
  double dVar6;
  Mat3x3d momentInertia;
  Vector3d angMom;
  Vector3d linMom;
  int count;
  Vector3d angMom_Temp;
  Vector3d linMom_Temp;
  RealType kb;
  int i;
  StuntDouble *sd;
  Vector<double,_3U> *in_stack_fffffffffffffdb8;
  StuntDouble *in_stack_fffffffffffffdc0;
  StuntDouble *in_stack_fffffffffffffdc8;
  SelectionManager *in_stack_fffffffffffffdd0;
  SelectionEvaluator *in_stack_fffffffffffffdf8;
  RectMatrix<double,_3U,_3U> local_130;
  Vector<double,_3U> local_e8 [3];
  Vector<double,_3U> local_a0;
  int local_84;
  Vector<double,_3U> local_80;
  Vector<double,_3U> local_68;
  undefined8 local_50;
  StuntDouble *local_18;
  
  bVar3 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x120));
  if (bVar3) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffdf8);
    SelectionManager::setSelectionSet
              (in_stack_fffffffffffffdd0,(SelectionSet *)in_stack_fffffffffffffdc8);
    SelectionSet::~SelectionSet((SelectionSet *)0x12277f);
  }
  local_50 = 0x3eabe61c15b8dbc3;
  Vector3<double>::Vector3((Vector3<double> *)0x1227c5);
  Vector3<double>::Vector3((Vector3<double> *)0x1227d2);
  local_84 = 0;
  local_18 = SelectionManager::beginSelected
                       (in_stack_fffffffffffffdd0,(int *)in_stack_fffffffffffffdc8);
  while (local_18 != (StuntDouble *)0x0) {
    local_84 = local_84 + 1;
    StuntDouble::getVel(in_stack_fffffffffffffdc8);
    StuntDouble::getMass(local_18);
    OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffdc8,
                      (double)in_stack_fffffffffffffdc0);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8)
    ;
    pdVar4 = Vector<double,_3U>::operator[](&local_a0,0);
    dVar6 = *pdVar4;
    pdVar4 = Vector<double,_3U>::operator[](&local_a0,0);
    dVar1 = *pdVar4;
    RVar5 = StuntDouble::getMass(local_18);
    pdVar4 = Vector<double,_3U>::operator[](&local_68,0);
    *pdVar4 = (dVar6 * dVar1) / (RVar5 * 8.31451e-07) + *pdVar4;
    pdVar4 = Vector<double,_3U>::operator[](&local_a0,1);
    dVar6 = *pdVar4;
    pdVar4 = Vector<double,_3U>::operator[](&local_a0,1);
    dVar1 = *pdVar4;
    RVar5 = StuntDouble::getMass(local_18);
    pdVar4 = Vector<double,_3U>::operator[](&local_68,1);
    *pdVar4 = (dVar6 * dVar1) / (RVar5 * 8.31451e-07) + *pdVar4;
    pdVar4 = Vector<double,_3U>::operator[](&local_a0,2);
    dVar6 = *pdVar4;
    pdVar4 = Vector<double,_3U>::operator[](&local_a0,2);
    dVar1 = *pdVar4;
    RVar5 = StuntDouble::getMass(local_18);
    pdVar4 = Vector<double,_3U>::operator[](&local_68,2);
    *pdVar4 = (dVar6 * dVar1) / (RVar5 * 8.31451e-07) + *pdVar4;
    bVar3 = StuntDouble::isDirectional(in_stack_fffffffffffffdc0);
    if (bVar3) {
      StuntDouble::getJ(in_stack_fffffffffffffdc8);
      (*local_18->_vptr_StuntDouble[5])(&local_130);
      pdVar4 = Vector<double,_3U>::operator[](local_e8,0);
      dVar6 = *pdVar4;
      pdVar4 = Vector<double,_3U>::operator[](local_e8,0);
      dVar1 = *pdVar4;
      pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_130,0,0);
      dVar2 = *pdVar4;
      pdVar4 = Vector<double,_3U>::operator[](&local_80,0);
      *pdVar4 = *pdVar4 + (dVar6 * dVar1) / (dVar2 * 8.31451e-07);
      pdVar4 = Vector<double,_3U>::operator[](local_e8,1);
      dVar6 = *pdVar4;
      pdVar4 = Vector<double,_3U>::operator[](local_e8,1);
      dVar1 = *pdVar4;
      pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_130,1,1);
      dVar6 = (dVar6 * dVar1) / (*pdVar4 * 8.31451e-07);
      pdVar4 = Vector<double,_3U>::operator[](&local_80,1);
      *pdVar4 = *pdVar4 + dVar6;
      pdVar4 = Vector<double,_3U>::operator[](local_e8,2);
      dVar6 = *pdVar4;
      pdVar4 = Vector<double,_3U>::operator[](local_e8,2);
      in_stack_fffffffffffffdd0 = (SelectionManager *)(dVar6 * *pdVar4);
      pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_130,2,2);
      in_stack_fffffffffffffdc0 =
           (StuntDouble *)((double)in_stack_fffffffffffffdd0 / (*pdVar4 * 8.31451e-07));
      in_stack_fffffffffffffdc8 = (StuntDouble *)Vector<double,_3U>::operator[](&local_80,2);
      in_stack_fffffffffffffdc8->_vptr_StuntDouble =
           (_func_int **)
           ((double)in_stack_fffffffffffffdc0 + (double)in_stack_fffffffffffffdc8->_vptr_StuntDouble
           );
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x122d00);
    }
    local_18 = SelectionManager::nextSelected
                         (in_stack_fffffffffffffdd0,(int *)in_stack_fffffffffffffdc8);
  }
  Vector<double,_3U>::operator/=
            ((Vector<double,_3U> *)in_stack_fffffffffffffdc0,(double)in_stack_fffffffffffffdb8);
  Vector<double,_3U>::operator/=
            ((Vector<double,_3U> *)in_stack_fffffffffffffdc0,(double)in_stack_fffffffffffffdb8);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8);
  return;
}

Assistant:

void Equipartition::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    const RealType kb = 8.31451e-7;
    Vector3d linMom_Temp;
    Vector3d angMom_Temp;
    int count = 0;
    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      count++;
      Vector3d linMom = sd->getVel() * sd->getMass();
      linMom_Temp[0] += linMom[0] * linMom[0] / (kb * sd->getMass());
      linMom_Temp[1] += linMom[1] * linMom[1] / (kb * sd->getMass());
      linMom_Temp[2] += linMom[2] * linMom[2] / (kb * sd->getMass());
      if (sd->isDirectional()) {
        Vector3d angMom       = sd->getJ();
        Mat3x3d momentInertia = sd->getI();
        angMom_Temp[0] += angMom[0] * angMom[0] / (kb * momentInertia(0, 0));
        angMom_Temp[1] += angMom[1] * angMom[1] / (kb * momentInertia(1, 1));
        angMom_Temp[2] += angMom[2] * angMom[2] / (kb * momentInertia(2, 2));
      }
    }

    linMom_Temp /= count;
    angMom_Temp /= count;
    TempP_.push_back(linMom_Temp);
    TempJ_.push_back(angMom_Temp);
  }